

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sleeplock.cpp
# Opt level: O0

bool __thiscall ON_SleepLock::IsLocked(ON_SleepLock *this)

{
  __atomic_flag_data_type _Var1;
  bool bVar2;
  bool b;
  ON_SleepLock *this_local;
  memory_order __b;
  
  LOCK();
  _Var1 = (this->m_lockedX).super___atomic_flag_base._M_i;
  (this->m_lockedX).super___atomic_flag_base._M_i = true;
  UNLOCK();
  bVar2 = _Var1 != false;
  if (!bVar2) {
    std::operator&(memory_order_release,__memory_order_mask);
    (this->m_lockedX).super___atomic_flag_base._M_i = false;
  }
  return bVar2;
}

Assistant:

bool ON_SleepLock::IsLocked() const
{
  // ON_SleepLock::IsLocked() is not reliable. Do not use it. It will be deleted in the next SDK.
#if defined(ON_SLEEPLOCK_USES_STD_ATOMIC_FLAG)
  const bool b = m_lockedX.test_and_set(std::memory_order_acquire);
  if (false == b)
    m_lockedX.clear(std::memory_order_release);
  return b;
#else
  return 0 != m_locked;
#endif
}